

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
          (Persistence_landscape *this,char *filename,size_t dimension,size_t number_of_levels)

{
  size_t sVar1;
  allocator<char> local_79;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> barcode;
  string local_58 [32];
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_38;
  
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  barcode.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  barcode.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  barcode.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = number_of_levels;
  std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_79);
  read_persistence_intervals_in_one_dimension_from_file
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &local_38,(Persistence_representations *)local_58,(string *)(dimension & 0xffffffff),
             (int)sVar1,-1.0);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_move_assign(&barcode,&local_38);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_38);
  std::__cxx11::string::~string(local_58);
  construct_persistence_landscape_from_barcode(this,&barcode,number_of_levels);
  sVar1 = ((long)(this->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  this->number_of_functions_for_vectorization = sVar1;
  this->number_of_functions_for_projections_to_reals = sVar1;
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&barcode.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return;
}

Assistant:

Persistence_landscape::Persistence_landscape(const char* filename, size_t dimension, size_t number_of_levels) {
  std::vector<std::pair<double, double> > barcode;
  if (dimension < std::numeric_limits<double>::max()) {
    barcode = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  } else {
    barcode = read_persistence_intervals_in_one_dimension_from_file(filename);
  }
  this->construct_persistence_landscape_from_barcode(barcode, number_of_levels);
  this->set_up_numbers_of_functions_for_vectorization_and_projections_to_reals();
}